

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomProcessingInstructionPrivate * __thiscall
QDomDocumentPrivate::createProcessingInstruction
          (QDomDocumentPrivate *this,QString *target,QString *data)

{
  QAtomicInt *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  long lVar5;
  QDomProcessingInstructionPrivate *this_00;
  byte bVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QArrayDataPointer<char16_t> local_78;
  bool ok;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ok = true;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (QDomImplementationPrivate::invalidDataPolicy == AcceptInvalidChars) {
    ok = true;
    local_78.d = (data->d).d;
    local_78.ptr = (data->d).ptr;
    local_78.size = (data->d).size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar6 = 1;
      goto LAB_00114be9;
    }
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    fixedCharData((QString *)&local_58,data,&ok);
    if (ok == true) {
      while (QVar7.m_data = (char *)0x2, QVar7.m_size = (qsizetype)&local_58,
            lVar5 = QString::indexOf(QVar7,0x11c916,CaseInsensitive), qVar4 = local_58.size,
            pcVar3 = local_58.ptr, pDVar2 = local_58.d, lVar5 != -1) {
        if (QDomImplementationPrivate::invalidDataPolicy == ReturnNullNode) {
          ok = false;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          goto LAB_00114bd8;
        }
        QString::remove((longlong)&local_58,lVar5);
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      ok = true;
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_78.size = qVar4;
    }
    else {
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
    }
LAB_00114bd8:
    bVar6 = ok;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00114be9:
    if ((bVar6 & 1) == 0) {
      this_00 = (QDomProcessingInstructionPrivate *)0x0;
      goto LAB_00114c4f;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QDomProcessingInstructionPrivate *)0x0;
  fixedXmlName((QString *)&local_58,target,&ok,false);
  if (ok == true) {
    this_00 = (QDomProcessingInstructionPrivate *)operator_new(0xa8);
    QDomProcessingInstructionPrivate::QDomProcessingInstructionPrivate
              (this_00,this,(QDomNodePrivate *)0x0,(QString *)&local_58,(QString *)&local_78);
    LOCK();
    pQVar1 = &(this_00->super_QDomNodePrivate).ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00114c4f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QDomProcessingInstructionPrivate* QDomDocumentPrivate::createProcessingInstruction(const QString &target,
                                                                                   const QString &data)
{
    bool ok;
    QString fixedData = fixedPIData(data, &ok);
    if (!ok)
        return nullptr;
    // [17] PITarget ::= Name - (('X' | 'x') ('M' | 'm') ('L' | 'l'))
    QString fixedTarget = fixedXmlName(target, &ok);
    if (!ok)
        return nullptr;

    QDomProcessingInstructionPrivate *p = new QDomProcessingInstructionPrivate(this, nullptr, fixedTarget, fixedData);
    p->ref.deref();
    return p;
}